

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int CollectionCacheInstallRecord(unqlite_col *pCol,jx9_int64 nId,jx9_value *pValue)

{
  sxu32 sVar1;
  unqlite_col *puVar2;
  unqlite_col *puVar3;
  sxi32 sVar4;
  sxu32 sVar5;
  unqlite_col_record *puVar6;
  unqlite_col_record *puVar7;
  uint uVar8;
  unqlite_col_record **ppuVar9;
  bool bVar10;
  
  puVar6 = CollectionCacheFetchRecord(pCol,nId);
  if (puVar6 != (unqlite_col_record *)0x0) {
    sVar4 = jx9MemObjStore(pValue,&puVar6->sValue);
    return sVar4;
  }
  puVar6 = (unqlite_col_record *)SyMemBackendPoolAlloc(&pCol->pVm->sAlloc,0x70);
  if (puVar6 != (unqlite_col_record *)0x0) {
    SyZero(puVar6,0x70);
    jx9MemObjInit(pCol->pVm->pJx9Vm,&puVar6->sValue);
    jx9MemObjStore(pValue,&puVar6->sValue);
    puVar6->nId = nId;
    puVar6->pCol = pCol;
    sVar1 = pCol->nRecSize;
    uVar8 = (uint)nId & sVar1 - 1;
    ppuVar9 = pCol->apRecord;
    puVar7 = ppuVar9[uVar8];
    puVar6->pNextCol = puVar7;
    if (puVar7 != (unqlite_col_record *)0x0) {
      puVar7->pPrevCol = puVar6;
    }
    ppuVar9[uVar8] = puVar6;
    puVar7 = pCol->pList;
    if (puVar7 != (unqlite_col_record *)0x0) {
      puVar6->pNext = puVar7;
      puVar7->pPrev = puVar6;
    }
    pCol->pList = puVar6;
    uVar8 = pCol->nRec + 1;
    pCol->nRec = uVar8;
    bVar10 = uVar8 < sVar1 * 3;
    puVar6 = (unqlite_col_record *)(ulong)CONCAT31((int3)(uVar8 >> 8),99999 < uVar8 || bVar10);
    if (99999 >= uVar8 && !bVar10) {
      puVar7 = (unqlite_col_record *)SyMemBackendAlloc(&pCol->pVm->sAlloc,sVar1 << 4);
      puVar6 = puVar7;
      if (puVar7 != (unqlite_col_record *)0x0) {
        ppuVar9 = &pCol->pList;
        SyZero(puVar7,sVar1 << 4);
        sVar5 = pCol->nRec;
        while (bVar10 = sVar5 != 0, sVar5 = sVar5 - 1, bVar10) {
          puVar2 = (unqlite_col *)*ppuVar9;
          *(undefined8 *)&(puVar2->sSchema).sBlob.nFlags = 0;
          *(undefined8 *)&(puVar2->sSchema).nIdx = 0;
          uVar8 = *(uint *)&(puVar2->sName).zString & sVar1 * 2 - 1;
          puVar3 = (&puVar7->pCol)[uVar8];
          *(unqlite_col **)&(puVar2->sSchema).sBlob.nFlags = puVar3;
          if (puVar3 != (unqlite_col *)0x0) {
            *(unqlite_col **)&(puVar3->sSchema).nIdx = puVar2;
          }
          (&puVar7->pCol)[uVar8] = puVar2;
          ppuVar9 = (unqlite_col_record **)&puVar2->nSchemaOfft;
        }
        uVar8 = SyMemBackendFree(&pCol->pVm->sAlloc,pCol->apRecord);
        puVar6 = (unqlite_col_record *)(ulong)uVar8;
        pCol->apRecord = (unqlite_col_record **)puVar7;
        pCol->nRecSize = sVar1 * 2;
      }
    }
  }
  return (int)puVar6;
}

Assistant:

static int CollectionCacheInstallRecord(
	unqlite_col *pCol, /* Target collection */
	jx9_int64 nId,     /* Unique record ID */
	jx9_value *pValue  /* JSON value */
	)
{
	unqlite_col_record *pRecord;
	sxu32 iBucket;
	/* Fetch the record first */
	pRecord = CollectionCacheFetchRecord(pCol,nId);
	if( pRecord ){
		/* Record already installed, overwrite its old value  */
		jx9MemObjStore(pValue,&pRecord->sValue);
		return UNQLITE_OK;
	}
	/* Allocate a new instance */
	pRecord = (unqlite_col_record *)SyMemBackendPoolAlloc(&pCol->pVm->sAlloc,sizeof(unqlite_col_record));
	if( pRecord == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pRecord,sizeof(unqlite_col_record));
	/* Fill in the structure */
	jx9MemObjInit(pCol->pVm->pJx9Vm,&pRecord->sValue);
	jx9MemObjStore(pValue,&pRecord->sValue);
	pRecord->nId = nId;
	pRecord->pCol = pCol;
	/* Install in the corresponding bucket */
	iBucket = COL_RECORD_HASH(nId) & (pCol->nRecSize - 1);
	pRecord->pNextCol = pCol->apRecord[iBucket];
	if( pCol->apRecord[iBucket] ){
		pCol->apRecord[iBucket]->pPrevCol = pRecord;
	}
	pCol->apRecord[iBucket] = pRecord;
	/* Link */
	MACRO_LD_PUSH(pCol->pList,pRecord);
	pCol->nRec++;
	if( (pCol->nRec >= pCol->nRecSize * 3) && pCol->nRec < 100000 ){
		/* Allocate a new larger table */
		sxu32 nNewSize = pCol->nRecSize << 1;
		unqlite_col_record *pEntry;
		unqlite_col_record **apNew;
		sxu32 n;
		
		apNew = (unqlite_col_record **)SyMemBackendAlloc(&pCol->pVm->sAlloc, nNewSize * sizeof(unqlite_col_record *));
		if( apNew ){
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(unqlite_col_record *));
			/* Rehash all entries */
			n = 0;
			pEntry = pCol->pList;
			for(;;){
				/* Loop one */
				if( n >= pCol->nRec ){
					break;
				}
				pEntry->pNextCol = pEntry->pPrevCol = 0;
				/* Install in the new bucket */
				iBucket = COL_RECORD_HASH(pEntry->nId) & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				if( apNew[iBucket]  ){
					apNew[iBucket]->pPrevCol = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(&pCol->pVm->sAlloc,(void *)pCol->apRecord);
			pCol->apRecord = apNew;
			pCol->nRecSize = nNewSize;
		}
	}
	/* All done */
	return UNQLITE_OK;
}